

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

void __thiscall
QSQLiteDriver::handleNotification(QSQLiteDriver *this,QString *tableName,qint64 rowid)

{
  bool bVar1;
  QSQLiteDriverPrivate *this_00;
  longlong in_RDX;
  NotificationSource in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QSQLiteDriverPrivate *d;
  undefined8 in_stack_ffffffffffffffa8;
  CaseSensitivity cs;
  QVariant local_28;
  long local_8;
  
  cs = (CaseSensitivity)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSQLiteDriver *)0x11a0a4);
  bVar1 = QListSpecialMethods<QString>::contains((QListSpecialMethods<QString> *)this_00,in_RDI,cs);
  if (bVar1) {
    QVariant::QVariant(&local_28,in_RDX);
    QSqlDriver::notification((QString *)in_RDI,in_ESI,(QVariant *)0x0);
    QVariant::~QVariant(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSQLiteDriver::handleNotification(const QString &tableName, qint64 rowid)
{
    Q_D(const QSQLiteDriver);
    if (d->notificationid.contains(tableName))
        emit notification(tableName, QSqlDriver::UnknownSource, QVariant(rowid));
}